

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O2

int Gia_Sim2CompareZero(uint *p0,int nWords,int fCompl)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  if (0 < nWords) {
    uVar2 = (ulong)(uint)nWords;
  }
  if (fCompl == 0) {
    uVar3 = 0;
    do {
      if (uVar2 == uVar3) {
        return 1;
      }
      puVar1 = p0 + uVar3;
      uVar3 = uVar3 + 1;
    } while (*puVar1 == 0);
  }
  else {
    uVar3 = 0;
    do {
      if (uVar2 == uVar3) {
        return 1;
      }
      puVar1 = p0 + uVar3;
      uVar3 = uVar3 + 1;
    } while (*puVar1 == 0xffffffff);
  }
  return 0;
}

Assistant:

int Gia_Sim2CompareZero( unsigned * p0, int nWords, int fCompl )
{
    int w;
    if ( !fCompl )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != 0 )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~0 )
                return 0;
        return 1;
    }
}